

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O3

void utf8IteratorSetState(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  byte bVar1;
  uint uVar2;
  UChar32 UVar3;
  uint uVar4;
  int32_t local_14;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (iter == (UCharIterator *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if ((uint)(iter->reservedField != 0) + iter->start * 2 != state) {
      if ((state & 0xfffffff9) != 1) {
        uVar2 = state >> 1;
        if ((int)uVar2 <= iter->limit) {
          iter->start = uVar2;
          uVar4 = 0xffffffff;
          if (state < 4) {
            uVar4 = uVar2;
          }
          iter->index = uVar4;
          if ((state & 1) == 0) {
            iter->reservedField = 0;
            return;
          }
          bVar1 = *(byte *)((long)iter->context + ((ulong)uVar2 - 1));
          if (((char)bVar1 < '\0') &&
             (UVar3 = utf8_prevCharSafeBody_63((uint8_t *)iter->context,0,&local_14,(uint)bVar1,-3),
             0xffff < UVar3)) {
            iter->reservedField = UVar3;
            return;
          }
        }
      }
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
utf8IteratorSetState(UCharIterator *iter,
                     uint32_t state,
                     UErrorCode *pErrorCode)
{
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if(state==utf8IteratorGetState(iter)) {
        /* setting to the current state: no-op */
    } else {
        int32_t index=(int32_t)(state>>1); /* UTF-8 index */
        state&=1; /* 1 if in surrogate pair, must be index>=4 */

        if((state==0 ? index<0 : index<4) || iter->limit<index) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        } else {
            iter->start=index; /* restore UTF-8 byte index */
            if(index<=1) {
                iter->index=index;
            } else {
                iter->index=-1; /* unknown UTF-16 index */
            }
            if(state==0) {
                iter->reservedField=0;
            } else {
                /* verified index>=4 above */
                UChar32 c;
                U8_PREV_OR_FFFD((const uint8_t *)iter->context, 0, index, c);
                if(c<=0xffff) {
                    *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                } else {
                    iter->reservedField=c;
                }
            }
        }
    }
}